

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O1

cupdlp_int csr_clear(CUPDLPcsr *csr)

{
  if (csr != (CUPDLPcsr *)0x0) {
    if (csr->rowMatBeg != (cupdlp_int *)0x0) {
      free(csr->rowMatBeg);
      csr->rowMatBeg = (cupdlp_int *)0x0;
    }
    if (csr->rowMatIdx != (cupdlp_int *)0x0) {
      free(csr->rowMatIdx);
      csr->rowMatIdx = (cupdlp_int *)0x0;
    }
    if (csr->rowMatElem != (cupdlp_float *)0x0) {
      free(csr->rowMatElem);
      csr->rowMatElem = (cupdlp_float *)0x0;
    }
    free(csr);
  }
  return 0;
}

Assistant:

cupdlp_int csr_clear(CUPDLPcsr *csr) {
  if (csr) {
#ifndef CUPDLP_CPU
    if (csr->cuda_csr != NULL) {
      CHECK_CUSPARSE(cusparseDestroySpMat(csr->cuda_csr))
    }
#endif
    if (csr->rowMatBeg) {
      CUPDLP_FREE_VEC(csr->rowMatBeg);
    }
    if (csr->rowMatIdx) {
      CUPDLP_FREE_VEC(csr->rowMatIdx);
    }
    if (csr->rowMatElem) {
      CUPDLP_FREE_VEC(csr->rowMatElem);
    }
    cupdlp_free(csr);
  }
  return 0;
}